

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3InsertData(Fts3Table *p,sqlite3_value **apVal,sqlite3_int64 *piDocid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sqlite3_value *psVar4;
  sqlite3_stmt *psVar5;
  ushort uVar6;
  int iVar7;
  i64 iVar8;
  sqlite3_value *psVar9;
  long in_FS_OFFSET;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->zContentTbl == (char *)0x0) {
    local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar7 = fts3SqlStmt(p,0x12,&local_40,apVal + 1);
    psVar5 = local_40;
    if (iVar7 != 0) goto LAB_001b524f;
    if (p->zLanguageid != (char *)0x0) {
      iVar7 = p->nColumn;
      iVar8 = sqlite3VdbeIntValue(apVal[(long)iVar7 + 4]);
      iVar7 = sqlite3_bind_int(psVar5,iVar7 + 2,(int)iVar8);
      if (iVar7 != 0) goto LAB_001b524f;
    }
    psVar5 = local_40;
    psVar9 = apVal[(long)p->nColumn + 3];
    uVar1._0_2_ = psVar9->flags;
    uVar1._2_1_ = psVar9->enc;
    uVar1._3_1_ = psVar9->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      psVar4 = *apVal;
      uVar2._0_2_ = psVar4->flags;
      uVar2._2_1_ = psVar4->enc;
      uVar2._3_1_ = psVar4->eSubtype;
      if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) != 0) &&
         (psVar4 = apVal[1], uVar3._0_2_ = psVar4->flags, uVar3._2_1_ = psVar4->enc,
         uVar3._3_1_ = psVar4->eSubtype, (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        iVar7 = 1;
        goto LAB_001b524f;
      }
      iVar7 = sqlite3_bind_value(local_40,1,psVar9);
      if (iVar7 != 0) goto LAB_001b524f;
    }
    sqlite3_step(psVar5);
    iVar7 = sqlite3_reset(psVar5);
    iVar8 = p->db->lastRowid;
  }
  else {
    psVar9 = apVal[(long)p->nColumn + 3];
    uVar6 = psVar9->flags & 0x3f;
    if ((0xaaaaaaaaaaaaaaaaU >> uVar6 & 1) != 0) {
      psVar9 = apVal[1];
      uVar6 = psVar9->flags & 0x3f;
    }
    if ((0x50505050UL >> uVar6 & 1) == 0) {
      iVar7 = 0x13;
      goto LAB_001b524f;
    }
    iVar8 = sqlite3VdbeIntValue(psVar9);
    iVar7 = 0;
  }
  *piDocid = iVar8;
LAB_001b524f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int fts3InsertData(
  Fts3Table *p,                   /* Full-text table */
  sqlite3_value **apVal,          /* Array of values to insert */
  sqlite3_int64 *piDocid          /* OUT: Docid for row just inserted */
){
  int rc;                         /* Return code */
  sqlite3_stmt *pContentInsert;   /* INSERT INTO %_content VALUES(...) */

  if( p->zContentTbl ){
    sqlite3_value *pRowid = apVal[p->nColumn+3];
    if( sqlite3_value_type(pRowid)==SQLITE_NULL ){
      pRowid = apVal[1];
    }
    if( sqlite3_value_type(pRowid)!=SQLITE_INTEGER ){
      return SQLITE_CONSTRAINT;
    }
    *piDocid = sqlite3_value_int64(pRowid);
    return SQLITE_OK;
  }

  /* Locate the statement handle used to insert data into the %_content
  ** table. The SQL for this statement is:
  **
  **   INSERT INTO %_content VALUES(?, ?, ?, ...)
  **
  ** The statement features N '?' variables, where N is the number of user
  ** defined columns in the FTS3 table, plus one for the docid field.
  */
  rc = fts3SqlStmt(p, SQL_CONTENT_INSERT, &pContentInsert, &apVal[1]);
  if( rc==SQLITE_OK && p->zLanguageid ){
    rc = sqlite3_bind_int(
        pContentInsert, p->nColumn+2,
        sqlite3_value_int(apVal[p->nColumn+4])
    );
  }
  if( rc!=SQLITE_OK ) return rc;

  /* There is a quirk here. The users INSERT statement may have specified
  ** a value for the "rowid" field, for the "docid" field, or for both.
  ** Which is a problem, since "rowid" and "docid" are aliases for the
  ** same value. For example:
  **
  **   INSERT INTO fts3tbl(rowid, docid) VALUES(1, 2);
  **
  ** In FTS3, this is an error. It is an error to specify non-NULL values
  ** for both docid and some other rowid alias.
  */
  if( SQLITE_NULL!=sqlite3_value_type(apVal[3+p->nColumn]) ){
    if( SQLITE_NULL==sqlite3_value_type(apVal[0])
     && SQLITE_NULL!=sqlite3_value_type(apVal[1])
    ){
      /* A rowid/docid conflict. */
      return SQLITE_ERROR;
    }
    rc = sqlite3_bind_value(pContentInsert, 1, apVal[3+p->nColumn]);
    if( rc!=SQLITE_OK ) return rc;
  }

  /* Execute the statement to insert the record. Set *piDocid to the
  ** new docid value.
  */
  sqlite3_step(pContentInsert);
  rc = sqlite3_reset(pContentInsert);

  *piDocid = sqlite3_last_insert_rowid(p->db);
  return rc;
}